

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.h
# Opt level: O3

void __thiscall Js::ScriptContext::ClearDynamicProfileList(ScriptContext *this)

{
  SListNodeBase<Memory::Recycler> addr;
  
  addr.next.ptr =
       (Type)(((this->super_ScriptContextBase).javascriptLibrary)->cache).profileInfoList.ptr;
  if (addr.next.ptr != (SListNodeBase<Memory::Recycler> *)0x0) {
    Memory::Recycler::WBSetBit((char *)addr.next.ptr);
    *(Type *)addr.next.ptr = addr.next.ptr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier((void *)addr.next.ptr);
    *(undefined4 *)((long)addr.next.ptr + 8) = 0;
    (((this->super_ScriptContextBase).javascriptLibrary)->cache).profileInfoList.ptr =
         (SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)0x0;
  }
  return;
}

Assistant:

void ClearDynamicProfileList()
        {
            if (this->Cache()->profileInfoList)
            {
                this->Cache()->profileInfoList->Reset();
                this->Cache()->profileInfoList = nullptr;
            }
        }